

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# select_binder.cpp
# Opt level: O3

BindResult * __thiscall
duckdb::SelectBinder::BindColumnRef
          (BindResult *__return_storage_ptr__,SelectBinder *this,
          unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
          *expr_ptr,idx_t depth,bool root_expression)

{
  BoundSelectNode *pBVar1;
  _Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_> _Var2;
  pointer pcVar3;
  undefined8 uVar4;
  bool bVar5;
  ColumnRefExpression *this_00;
  reference pvVar6;
  iterator iVar7;
  const_iterator cVar8;
  BinderException *pBVar9;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  *this_01;
  undefined1 local_100 [8];
  undefined1 local_f8 [16];
  undefined1 *local_e8;
  undefined1 local_d8 [16];
  __node_base_ptr *local_c8 [2];
  __node_base_ptr local_b8 [2];
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_a8 [56];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  ExpressionBinder::BindExpression
            (__return_storage_ptr__,(ExpressionBinder *)this,expr_ptr,depth,false);
  if ((__return_storage_ptr__->error).initialized == true) {
    this_00 = BaseExpression::Cast<duckdb::ColumnRefExpression>
                        (&((expr_ptr->
                           super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                           )._M_t.
                           super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
                           .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl)->
                          super_BaseExpression);
    bVar5 = ColumnRefExpression::IsQualified(this_00);
    if (!bVar5) {
      pBVar1 = (this->super_BaseSelectBinder).node;
      this_01 = &this_00->column_names;
      pvVar6 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
               ::operator[](this_01,0);
      iVar7 = ::std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                      *)&pBVar1->bind_state,pvVar6);
      if (iVar7.
          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
          ._M_cur != (__node_type *)0x0) {
        local_f8._0_8_ =
             *(ulong *)((long)iVar7.
                              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
                              ._M_cur + 0x28);
        if ((Expression *)((this->super_BaseSelectBinder).node)->bound_column_count <=
            (ulong)local_f8._0_8_) {
          pBVar9 = (BinderException *)__cxa_allocate_exception(0x10);
          local_f8._0_8_ = local_f8 + 0x10;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)(local_100 + 8),
                     "Column \"%s\" referenced that exists in the SELECT clause - but this column cannot be referenced before it is defined"
                     ,"");
          pvVar6 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                   ::operator[](this_01,0);
          local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
          pcVar3 = (pvVar6->_M_dataplus)._M_p;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_50,pcVar3,pcVar3 + pvVar6->_M_string_length);
          BinderException::BinderException<std::__cxx11::string>
                    (pBVar9,(string *)(local_100 + 8),&local_50);
          __cxa_throw(pBVar9,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
        }
        cVar8 = ::std::
                _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                ::find(&(pBVar1->bind_state).subquery_expressions._M_h,(key_type *)(local_100 + 8));
        if (cVar8.super__Node_iterator_base<unsigned_long,_false>._M_cur != (__node_type *)0x0) {
          pBVar9 = (BinderException *)__cxa_allocate_exception(0x10);
          local_f8._0_8_ = local_f8 + 0x10;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)(local_100 + 8),
                     "Alias \"%s\" referenced in a SELECT clause - but the expression has a subquery. This is not yet supported."
                     ,"");
          pvVar6 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                   ::operator[](this_01,0);
          local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
          pcVar3 = (pvVar6->_M_dataplus)._M_p;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_70,pcVar3,pcVar3 + pvVar6->_M_string_length);
          BinderException::BinderException<std::__cxx11::string>
                    (pBVar9,(string *)(local_100 + 8),&local_70);
          __cxa_throw(pBVar9,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
        }
        SelectBindState::BindAlias
                  ((SelectBindState *)local_100,
                   (idx_t)&((this->super_BaseSelectBinder).node)->bind_state);
        (*(this->super_BaseSelectBinder).super_ExpressionBinder._vptr_ExpressionBinder[5])
                  (local_100 + 8,this,local_100,depth,0);
        uVar4 = local_f8._0_8_;
        local_f8._0_8_ = (long *)0x0;
        _Var2.super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl =
             (__return_storage_ptr__->expression).
             super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
             super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
             _M_t.
             super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
             super__Head_base<0UL,_duckdb::Expression_*,_false>;
        (__return_storage_ptr__->expression).
        super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
        super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
        super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
        super__Head_base<0UL,_duckdb::Expression_*,_false> =
             (_Head_base<0UL,_duckdb::Expression_*,_false>)uVar4;
        if (_Var2.super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl !=
            (Expression *)0x0) {
          (**(code **)(*(long *)_Var2.super__Head_base<0UL,_duckdb::Expression_*,_false>.
                                _M_head_impl + 8))();
        }
        (__return_storage_ptr__->error).initialized = (bool)local_f8[8];
        (__return_storage_ptr__->error).type = local_f8[9];
        ::std::__cxx11::string::operator=
                  ((string *)&(__return_storage_ptr__->error).raw_message,
                   (string *)(local_f8 + 0x10));
        ::std::__cxx11::string::operator=
                  ((string *)&(__return_storage_ptr__->error).final_message,(string *)local_c8);
        ::std::
        _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
        ::_M_move_assign((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                          *)&(__return_storage_ptr__->error).extra_info,local_a8);
        ::std::
        _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
        ::~_Hashtable(local_a8);
        if (local_c8[0] != local_b8) {
          operator_delete(local_c8[0]);
        }
        if (local_e8 != local_d8) {
          operator_delete(local_e8);
        }
        if ((long *)local_f8._0_8_ != (long *)0x0) {
          (**(code **)(*(long *)local_f8._0_8_ + 8))();
        }
        if (local_100 != (undefined1  [8])0x0) {
          (*(code *)(*(__node_base_ptr *)local_100)[1]._M_nxt)();
        }
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

BindResult SelectBinder::BindColumnRef(unique_ptr<ParsedExpression> &expr_ptr, idx_t depth, bool root_expression) {
	// first try to bind the column reference regularly
	auto result = BaseSelectBinder::BindColumnRef(expr_ptr, depth, root_expression);
	if (!result.HasError()) {
		return result;
	}
	// binding failed
	// check in the alias map
	auto &colref = (expr_ptr.get())->Cast<ColumnRefExpression>();
	if (!colref.IsQualified()) {
		auto &bind_state = node.bind_state;
		auto alias_entry = node.bind_state.alias_map.find(colref.column_names[0]);
		if (alias_entry != node.bind_state.alias_map.end()) {
			// found entry!
			auto index = alias_entry->second;
			if (index >= node.bound_column_count) {
				throw BinderException("Column \"%s\" referenced that exists in the SELECT clause - but this column "
				                      "cannot be referenced before it is defined",
				                      colref.column_names[0]);
			}
			if (bind_state.AliasHasSubquery(index)) {
				throw BinderException("Alias \"%s\" referenced in a SELECT clause - but the expression has a subquery."
				                      " This is not yet supported.",
				                      colref.column_names[0]);
			}
			auto copied_expression = node.bind_state.BindAlias(index);
			result = BindExpression(copied_expression, depth, false);
			return result;
		}
	}
	// entry was not found in the alias map: return the original error
	return result;
}